

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall
TokenSequenceParser::addEntry
          (TokenSequenceParser *this,int result,TokenSequence tokens,TokenValueSequence values)

{
  initializer_list<TokenSequenceValue> __l;
  initializer_list<TokenType> __l_00;
  allocator<TokenSequenceValue> local_b9;
  iterator local_b8;
  size_type sStack_b0;
  allocator<TokenType> local_89;
  iterator local_88;
  size_type sStack_80;
  undefined1 local_70 [8];
  Entry entry;
  int result_local;
  TokenSequenceParser *this_local;
  TokenValueSequence values_local;
  TokenSequence tokens_local;
  
  sStack_80 = tokens._M_len;
  local_88 = tokens._M_array;
  entry._52_4_ = result;
  std::allocator<TokenType>::allocator(&local_89);
  __l_00._M_len = sStack_80;
  __l_00._M_array = local_88;
  std::vector<TokenType,_std::allocator<TokenType>_>::vector
            ((vector<TokenType,_std::allocator<TokenType>_> *)local_70,__l_00,&local_89);
  local_b8 = values._M_array;
  sStack_b0 = values._M_len;
  std::allocator<TokenSequenceValue>::allocator(&local_b9);
  __l._M_len = sStack_b0;
  __l._M_array = local_b8;
  std::vector<TokenSequenceValue,_std::allocator<TokenSequenceValue>_>::vector
            ((vector<TokenSequenceValue,_std::allocator<TokenSequenceValue>_> *)
             &entry.tokens.super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,__l,&local_b9);
  entry.values.super__Vector_base<TokenSequenceValue,_std::allocator<TokenSequenceValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = entry._52_4_;
  std::allocator<TokenSequenceValue>::~allocator(&local_b9);
  std::allocator<TokenType>::~allocator(&local_89);
  std::vector<TokenSequenceParser::Entry,_std::allocator<TokenSequenceParser::Entry>_>::push_back
            (&this->entries,(value_type *)local_70);
  Entry::~Entry((Entry *)local_70);
  return;
}

Assistant:

void TokenSequenceParser::addEntry(int result, TokenSequence tokens, TokenValueSequence values)
{
	Entry entry = { tokens, values, result };
	entries.push_back(entry);
}